

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DImporter::GeometryHelper_CoordIdxStr2FacesArr
          (X3DImporter *this,vector<int,_std::allocator<int>_> *pCoordIdx,
          vector<aiFace,_std::allocator<aiFace>_> *pFaces,uint *pPrimitiveTypes)

{
  pointer paVar1;
  void *pvVar2;
  bool bVar3;
  pointer __src;
  int iVar4;
  ulong __n;
  uint *puVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  aiFace tface;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inds;
  vector<int,_std::allocator<int>_> f_data;
  value_type local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<int,_std::allocator<int>_> local_50;
  uint *local_38;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_50,pCoordIdx);
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish[-1] != -1) {
    local_78.mNumIndices = 0xffffffff;
    if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_50,
                 (iterator)
                 local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_78);
    }
    else {
      *local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = -1;
      local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
  }
  std::vector<aiFace,_std::allocator<aiFace>_>::reserve
            (pFaces,(ulong)((long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 2) / 3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_68,4);
  local_38 = pPrimitiveTypes;
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    puVar5 = (uint *)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    do {
      __src = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
      if (*puVar5 == 0xffffffff) {
        local_78.mNumIndices = 0;
        local_78.mIndices = (uint *)0x0;
        __n = (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start;
        uVar8 = (long)__n >> 2;
        switch(uVar8) {
        case 0:
          iVar4 = 6;
          bVar3 = false;
          goto LAB_0062626e;
        case 1:
          uVar9 = 1;
          break;
        case 2:
          uVar9 = 2;
          break;
        case 3:
          uVar9 = 4;
          break;
        default:
          uVar9 = 8;
        }
        local_78.mNumIndices = (uint)uVar8;
        local_78.mIndices = (uint *)operator_new__(-(ulong)(uVar8 >> 0x3e != 0) | __n);
        memcpy(local_78.mIndices,__src,__n);
        std::vector<aiFace,_std::allocator<aiFace>_>::push_back(pFaces,&local_78);
        uVar7 = uVar7 | uVar9;
        iVar4 = 0;
        bVar3 = true;
        if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
LAB_0062626e:
        if (local_78.mIndices != (uint *)0x0) {
          operator_delete__(local_78.mIndices);
        }
        if (!bVar3) goto LAB_0062629b;
      }
      else {
        local_78.mNumIndices = *puVar5;
        if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_68,
                     (iterator)
                     local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_78.mNumIndices);
        }
        else {
          *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_78.mNumIndices;
          local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != (uint *)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
  }
  iVar4 = 2;
LAB_0062629b:
  if (iVar4 == 6) {
    lVar10 = (long)(pFaces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pFaces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
                   super__Vector_impl_data._M_start;
    if (lVar10 != 0) {
      lVar10 = lVar10 >> 4;
      lVar6 = 8;
      uVar8 = 0;
      do {
        paVar1 = (pFaces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(pFaces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)paVar1 >> 4) <= uVar8) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar8);
        }
        pvVar2 = *(void **)((long)&paVar1->mNumIndices + lVar6);
        if (pvVar2 != (void *)0x0) {
          operator_delete__(pvVar2);
        }
        uVar8 = uVar8 + 1;
        lVar6 = lVar6 + 0x10;
      } while (lVar10 + (ulong)(lVar10 == 0) != uVar8);
    }
    std::vector<aiFace,_std::allocator<aiFace>_>::clear(pFaces);
  }
  else if (iVar4 == 2) {
    *local_38 = uVar7;
  }
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if ((uint *)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (uint *)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void X3DImporter::GeometryHelper_CoordIdxStr2FacesArr(const std::vector<int32_t>& pCoordIdx, std::vector<aiFace>& pFaces, unsigned int& pPrimitiveTypes) const
{
    std::vector<int32_t> f_data(pCoordIdx);
    std::vector<unsigned int> inds;
    unsigned int prim_type = 0;

    if ( f_data.back() != ( -1 ) )
    {
        f_data.push_back( -1 );
    }

	// reserve average size.
	pFaces.reserve(f_data.size() / 3);
	inds.reserve(4);
    //PrintVectorSet("build. ci", pCoordIdx);
	for(std::vector<int32_t>::iterator it = f_data.begin(); it != f_data.end(); ++it)
	{
		// when face is got count how many indices in it.
		if(*it == (-1))
		{
			aiFace tface;
			size_t ts;

			ts = inds.size();
			switch(ts)
			{
				case 0: goto mg_m_err;
				case 1: prim_type |= aiPrimitiveType_POINT; break;
				case 2: prim_type |= aiPrimitiveType_LINE; break;
				case 3: prim_type |= aiPrimitiveType_TRIANGLE; break;
				default: prim_type |= aiPrimitiveType_POLYGON; break;
			}

			tface.mNumIndices = static_cast<unsigned int>(ts);
			tface.mIndices = new unsigned int[ts];
			memcpy(tface.mIndices, inds.data(), ts * sizeof(unsigned int));
			pFaces.push_back(tface);
			inds.clear();
		}// if(*it == (-1))
		else
		{
			inds.push_back(*it);
		}// if(*it == (-1)) else
	}// for(std::list<int32_t>::iterator it = f_data.begin(); it != f_data.end(); it++)
//PrintVectorSet("build. faces", pCoordIdx);

	pPrimitiveTypes = prim_type;

	return;

mg_m_err:

	for(size_t i = 0, i_e = pFaces.size(); i < i_e; i++) delete [] pFaces.at(i).mIndices;

	pFaces.clear();
}